

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O0

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  void *__dest;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  int p;
  float *em;
  int word_index;
  float *outptr;
  int q;
  int words;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  size_t in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar4;
  Mat *in_stack_ffffffffffffff80;
  int local_78;
  int local_4c;
  
  lVar1 = in_RSI[8];
  lVar2 = in_RSI[7];
  Mat::create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
              in_stack_ffffffffffffff70,
              (Allocator *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar3 = true;
  if (*in_RDX != 0) {
    bVar3 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
  }
  if (bVar3) {
    local_4c = -100;
  }
  else {
    for (local_78 = 0; local_78 < (int)lVar1 * (int)lVar2; local_78 = local_78 + 1) {
      __dest = (void *)(*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_78 * in_RDX[2]);
      iVar4 = *(int *)(*in_RSI + (long)local_78 * 4);
      if (iVar4 < 0) {
        iVar4 = 0;
      }
      if (*(int *)(in_RDI + 0xd4) <= iVar4) {
        iVar4 = *(int *)(in_RDI + 0xd4) + -1;
      }
      memcpy(__dest,(void *)(*(long *)(in_RDI + 0xe0) + (long)(*(int *)(in_RDI + 0xd0) * iVar4) * 4)
             ,(long)*(int *)(in_RDI + 0xd0) << 2);
      if (*(int *)(in_RDI + 0xd8) != 0) {
        for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0xd0); iVar4 = iVar4 + 1) {
          *(float *)((long)__dest + (long)iVar4 * 4) =
               *(float *)(*(long *)(in_RDI + 0x128) + (long)iVar4 * 4) +
               *(float *)((long)__dest + (long)iVar4 * 4);
        }
      }
    }
    local_4c = 0;
  }
  return local_4c;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = static_cast<int>(bottom_blob.total());

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < words; q++)
    {
        float* outptr = top_blob.row(q);

        int word_index = ((const int*)bottom_blob)[q];

        if (word_index < 0)
            word_index = 0;
        if (word_index >= input_dim)
            word_index = input_dim - 1;

        const float* em = (const float*)weight_data + num_output * word_index;

        memcpy(outptr, em, num_output * sizeof(float));

        if (bias_term)
        {
            for (int p = 0; p < num_output; p++)
            {
                outptr[p] += bias_data[p];
            }
        }
    }

    return 0;
}